

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O2

Dsd_Node_t *
dsdKernelFindContainingComponent
          (Dsd_Manager_t *pDsdMan,Dsd_Node_t *pWhere,DdNode *Var,int *fPolarity)

{
  long lVar1;
  int iVar2;
  long lVar3;
  Dsd_Node_t *pDVar4;
  
  if (pWhere->nDecs == 1) {
    pDVar4 = (Dsd_Node_t *)0x0;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (pWhere->nDecs <= lVar3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/dsd/dsdProc.c"
                      ,0x529,
                      "Dsd_Node_t *dsdKernelFindContainingComponent(Dsd_Manager_t *, Dsd_Node_t *, DdNode *, int *)"
                     );
      }
      pDVar4 = (Dsd_Node_t *)((ulong)pWhere->pDecs[lVar3] & 0xfffffffffffffffe);
      iVar2 = Extra_bddSuppContainVar(pDsdMan->dd,pDVar4->S,Var);
      lVar1 = lVar3 + 1;
    } while (iVar2 == 0);
    *fPolarity = (uint)(pWhere->pDecs[lVar3] != pDVar4);
  }
  return pDVar4;
}

Assistant:

Dsd_Node_t * dsdKernelFindContainingComponent( Dsd_Manager_t * pDsdMan, Dsd_Node_t * pWhere, DdNode * Var, int * fPolarity )

{
    Dsd_Node_t * pTemp;
    int i;

//  assert( !Dsd_IsComplement( pWhere ) );
//  assert( Extra_bddSuppContainVar( pDsdMan->dd, pWhere->S, Var ) );

    if ( pWhere->nDecs == 1 )
        return NULL;

    for( i = 0; i < pWhere->nDecs; i++ )
    {
        pTemp = Dsd_Regular( pWhere->pDecs[i] );
        if ( Extra_bddSuppContainVar( pDsdMan->dd, pTemp->S, Var ) )
        {
            *fPolarity = (int)( pTemp != pWhere->pDecs[i] );
            return pTemp;
        }
    }
    assert( 0 );
    return NULL;
}